

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qcombobox_p.cpp
# Opt level: O2

void QComboBoxPrivateContainer::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  
  if (_c == IndexOfMethod) {
    bVar1 = QtMocHelpers::indexOfMethod<void(QComboBoxPrivateContainer::*)(QModelIndex_const&)>
                      ((QtMocHelpers *)_a,(void **)itemSelected,0,0);
    if (!bVar1) {
      QtMocHelpers::indexOfMethod<void(QComboBoxPrivateContainer::*)()>
                ((QtMocHelpers *)_a,(void **)resetButton,0,1);
      return;
    }
  }
  else if (_c == InvokeMetaMethod) {
    switch(_id) {
    case 0:
      itemSelected((QComboBoxPrivateContainer *)_o,(QModelIndex *)_a[1]);
      return;
    case 1:
      resetButton((QComboBoxPrivateContainer *)_o);
      return;
    case 2:
      scrollItemView((QComboBoxPrivateContainer *)_o,*_a[1]);
      return;
    case 3:
      hideScrollers((QComboBoxPrivateContainer *)_o);
      return;
    case 4:
      updateScrollers((QComboBoxPrivateContainer *)_o);
      return;
    case 5:
      viewDestroyed((QComboBoxPrivateContainer *)_o);
      return;
    }
  }
  return;
}

Assistant:

void QComboBoxPrivateContainer::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QComboBoxPrivateContainer *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->itemSelected((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 1: _t->resetButton(); break;
        case 2: _t->scrollItemView((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 3: _t->hideScrollers(); break;
        case 4: _t->updateScrollers(); break;
        case 5: _t->viewDestroyed(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QComboBoxPrivateContainer::*)(const QModelIndex & )>(_a, &QComboBoxPrivateContainer::itemSelected, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QComboBoxPrivateContainer::*)()>(_a, &QComboBoxPrivateContainer::resetButton, 1))
            return;
    }
}